

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_tests.cpp
# Opt level: O0

void __thiscall
omp_range_simple_case_three_overload_Test::TestBody(omp_range_simple_case_three_overload_Test *this)

{
  initializer_list<long> __l;
  bool bVar1;
  reference pvVar2;
  char *message;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  value_type v;
  const_iterator __end1;
  const_iterator __begin1;
  range<int> *__range1;
  vector<long,_std::allocator<long>_> result;
  allocator<long> local_69;
  long local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<long,_std::allocator<long>_> expecting;
  omp_range_simple_case_three_overload_Test *this_local;
  
  local_68[2] = 3;
  local_68[3] = 4;
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[4] = 5;
  local_38 = local_68;
  local_30 = 5;
  expecting.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<long>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_28,__l,&local_69);
  std::allocator<long>::~allocator(&local_69);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&__range1)
  ;
  omp::range<int>::range((range<int> *)&__begin1,1,6);
  __end1 = omp::range<int>::begin((range<int> *)&__begin1);
  register0x00000000 = omp::range<int>::end((range<int> *)&__begin1);
  while (bVar1 = omp::details::range_iterator<int>::operator!=
                           (&__end1,(range_iterator<int> *)
                                    ((long)&gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 4)), bVar1) {
    pvVar2 = omp::details::range_iterator<int>::operator*(&__end1);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = *pvVar2;
    std::vector<long,std::allocator<long>>::emplace_back<int&>
              ((vector<long,std::allocator<long>> *)&__range1,(int *)&gtest_ar.message_);
    omp::details::range_iterator<int>::operator++(&__end1);
  }
  testing::internal::EqHelper::
  Compare<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_d0,"result","expecting",
             (vector<long,_std::allocator<long>_> *)&__range1,
             (vector<long,_std::allocator<long>_> *)local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/range_tests.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&__range1);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_28)
  ;
  return;
}

Assistant:

TEST(omp_range, simple_case_three_overload) {
  const std::vector<std::int64_t> expecting = {1, 2, 3, 4, 5};

  std::vector<std::int64_t> result;

  for (auto v : omp::range(1, 6))
    result.emplace_back(v);

  ASSERT_EQ(result, expecting);
}